

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O2

pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>_>
* __thiscall
phmap::priv::
base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
::equal_range(pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>_>
              *__return_storage_ptr__,
             base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
             *this,key_type *key)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_int>_>,_std::_Rb_tree_iterator<std::pair<const_int,_int>_>_>
  pVar5;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
  tree_iter;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
  tree_iter_00;
  
  pVar5 = std::
          _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::equal_range(&(this->checker_)._M_t,key);
  btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  ::equal_range<int>(__return_storage_ptr__,
                     (btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                      *)this,key);
  uVar1 = (__return_storage_ptr__->first).node;
  uVar2 = (__return_storage_ptr__->first).position;
  tree_iter.position = uVar2;
  tree_iter.node =
       (btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)uVar1;
  tree_iter._12_4_ = 0;
  base_checker<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>,std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
  ::
  iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>,std::pair<int_const,int>&,std::pair<int_const,int>*>,std::_Rb_tree_iterator<std::pair<int_const,int>>>
            ((base_checker<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>,std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
              *)this,tree_iter,pVar5.first._M_node);
  uVar3 = (__return_storage_ptr__->second).node;
  uVar4 = (__return_storage_ptr__->second).position;
  tree_iter_00.position = uVar4;
  tree_iter_00.node =
       (btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)uVar3;
  tree_iter_00._12_4_ = 0;
  base_checker<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>,std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
  ::
  iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>,std::pair<int_const,int>&,std::pair<int_const,int>*>,std::_Rb_tree_iterator<std::pair<int_const,int>>>
            ((base_checker<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>,std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
              *)this,tree_iter_00,pVar5.second._M_node);
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, iterator> equal_range(const key_type &key) {
        std::pair<typename CheckerType::iterator, typename CheckerType::iterator>
            checker_res = checker_.equal_range(key);
        std::pair<iterator, iterator> tree_res = tree_.equal_range(key);
        iter_check(tree_res.first, checker_res.first);
        iter_check(tree_res.second, checker_res.second);
        return tree_res;
    }